

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_settop(lua_State *L,int idx)

{
  int iVar1;
  int *piVar2;
  StkId pTVar3;
  StkId pTVar4;
  
  piVar2 = *(int **)&L[-1].hookmask;
  iVar1 = *piVar2;
  pTVar3 = L->ci->func;
  *piVar2 = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xb3,"void lua_settop(lua_State *, int)");
  }
  if (idx < 0) {
    if ((long)L->top + (-0x10 - (long)pTVar3) >> 4 < (long)(ulong)(uint)~idx) {
      __assert_fail("(-(idx+1) <= (L->top - (func + 1))) && \"invalid new top\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xbb,"void lua_settop(lua_State *, int)");
    }
    pTVar3 = L->top + (long)idx + 1;
  }
  else {
    pTVar3 = pTVar3 + 1;
    if ((long)L->stack_last - (long)pTVar3 >> 4 < (long)(ulong)(uint)idx) {
      __assert_fail("(idx <= L->stack_last - (func + 1)) && \"new top too large\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xb5,"void lua_settop(lua_State *, int)");
    }
    pTVar3 = pTVar3 + (uint)idx;
    pTVar4 = L->top;
    while (pTVar4 < pTVar3) {
      L->top = pTVar4 + 1;
      pTVar4->tt_ = 0;
      pTVar4 = pTVar4 + 1;
    }
  }
  L->top = pTVar3;
  *piVar2 = 0;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* 'subtract' index (index is negative) */
  }
  lua_unlock(L);
}